

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.hpp
# Opt level: O2

void __thiscall license::License::~License(License *this)

{
  this->_vptr_License = (_func_int **)&PTR__License_005bead0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->values_map)._M_t);
  std::__cxx11::string::~string((string *)&this->m_project_folder);
  std::__cxx11::string::~string((string *)&this->m_feature_names);
  std::__cxx11::string::~string((string *)&this->m_private_key);
  return;
}

Assistant:

inline virtual ~License() {}